

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O1

void __thiscall deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::deinit(SRGBTestCase *this)

{
  SRGBTestTexture *pSVar1;
  SRGBTestSampler *pSVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer puVar5;
  pointer ppSVar6;
  pointer ppSVar7;
  pointer ppSVar8;
  pointer ppSVar9;
  pointer puVar10;
  ulong uVar11;
  long lVar12;
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  local_30;
  long lVar4;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  local_30.m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)0x0;
  if ((this->m_framebuffer).
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      .m_data.ptr != (TypedObjectWrapper<(glu::ObjectType)3> *)0x0) {
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::reset(&(this->m_framebuffer).
             super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
           );
    (this->m_framebuffer).
    super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)0x0;
  }
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::reset(&local_30);
  puVar10 = (this->m_renderBufferList).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar5 = (this->m_renderBufferList).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar5 != puVar10) {
    lVar12 = 0;
    uVar11 = 0;
    do {
      (**(code **)(lVar4 + 0x460))(1,(long)puVar10 + lVar12);
      uVar11 = uVar11 + 1;
      puVar10 = (this->m_renderBufferList).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar5 = (this->m_renderBufferList).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar12 = lVar12 + 4;
    } while (uVar11 < (ulong)((long)puVar5 - (long)puVar10 >> 2));
  }
  if (puVar5 != puVar10) {
    (this->m_renderBufferList).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar10;
  }
  ppSVar6 = (this->m_textureSourceList).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar8 = (this->m_textureSourceList).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppSVar8 != ppSVar6) {
    uVar11 = 0;
    do {
      pSVar1 = ppSVar6[uVar11];
      if (pSVar1 != (SRGBTestTexture *)0x0) {
        glu::Texture2D::~Texture2D(&pSVar1->m_source);
        operator_delete(pSVar1,0xb8);
      }
      uVar11 = uVar11 + 1;
      ppSVar6 = (this->m_textureSourceList).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppSVar8 = (this->m_textureSourceList).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar11 < (ulong)((long)ppSVar8 - (long)ppSVar6 >> 3));
  }
  if (ppSVar8 != ppSVar6) {
    (this->m_textureSourceList).
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppSVar6;
  }
  ppSVar7 = (this->m_samplerList).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar9 = (this->m_samplerList).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppSVar9 != ppSVar7) {
    uVar11 = 0;
    do {
      pSVar2 = ppSVar7[uVar11];
      if (pSVar2 != (SRGBTestSampler *)0x0) {
        (*pSVar2->m_gl->deleteSamplers)(1,&pSVar2->m_samplerHandle);
        operator_delete(pSVar2,0x28);
      }
      uVar11 = uVar11 + 1;
      ppSVar7 = (this->m_samplerList).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppSVar9 = (this->m_samplerList).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar11 < (ulong)((long)ppSVar9 - (long)ppSVar7 >> 3));
  }
  if (ppSVar9 != ppSVar7) {
    (this->m_samplerList).
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppSVar7;
  }
  if (this->m_vaoID != 0) {
    (**(code **)(lVar4 + 0x490))(1,&this->m_vaoID);
    this->m_vaoID = 0;
  }
  if (this->m_vertexDataID != 0) {
    (**(code **)(lVar4 + 0x438))(1,&this->m_vertexDataID);
    this->m_vertexDataID = 0;
  }
  return;
}

Assistant:

void SRGBTestCase::deinit (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_framebuffer	= de::MovePtr<glu::Framebuffer>(DE_NULL);

	for (std::size_t renderBufferIdx = 0; renderBufferIdx < m_renderBufferList.size(); renderBufferIdx++)
	{
		gl.deleteRenderbuffers(1, &m_renderBufferList[renderBufferIdx]);
	}
	m_renderBufferList.clear();

	for (std::size_t textureSourceIdx = 0; textureSourceIdx < m_textureSourceList.size(); textureSourceIdx++)
	{
		delete m_textureSourceList[textureSourceIdx];
	}
	m_textureSourceList.clear();

	for (std::size_t samplerIdx = 0; samplerIdx < m_samplerList.size(); samplerIdx++)
	{
		delete m_samplerList[samplerIdx];
	}
	m_samplerList.clear();

	if (m_vaoID != 0)
	{
		gl.deleteVertexArrays(1, &m_vaoID);
		m_vaoID = 0;
	}

	if (m_vertexDataID != 0)
	{
		gl.deleteBuffers(1, &m_vertexDataID);
		m_vertexDataID = 0;
	}
}